

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

bool re2::IsAnchorEnd(Regexp **pre,int depth)

{
  uint8 uVar1;
  ushort uVar2;
  bool bVar3;
  Regexp *in_RAX;
  ulong uVar4;
  Regexp **sub_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Regexp *pRVar6;
  Regexp *this;
  long lVar7;
  Regexp *sub;
  Regexp *local_38;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) {
    return false;
  }
  uVar1 = this->op_;
  if (uVar1 == '\x13') {
    local_38 = in_RAX;
    pRVar6 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_00125651:
    *pre = pRVar6;
LAB_00125654:
    bVar3 = true;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar5 = &this->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar5->subone_);
      bVar3 = IsAnchorEnd(&local_38,depth + 1);
      if (bVar3) {
        if (this->op_ != '\v') {
          __assert_fail("(op_) == (kRegexpCapture)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h"
                        ,0x14b,"int re2::Regexp::cap()");
        }
        pRVar6 = Regexp::Capture(local_38,(uint)this->parse_flags_,(this->field_7).field_0.max_);
        goto LAB_00125651;
      }
    }
    else {
      if (uVar1 != '\x05') {
        return false;
      }
      uVar4 = (ulong)this->nsub_;
      if (uVar4 == 0) {
        return false;
      }
      paVar5 = &this->field_5;
      if (uVar4 != 1) {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar5[uVar4 - 1].subone_);
      bVar3 = IsAnchorEnd(&local_38,depth + 1);
      if (bVar3) {
        uVar2 = this->nsub_;
        uVar4 = (ulong)uVar2;
        sub_00 = (Regexp **)operator_new__((ulong)((uint)uVar2 * 8));
        *(Regexp **)((long)sub_00 + ((ulong)((uint)uVar2 * 8) - 8)) = local_38;
        if (1 < uVar2) {
          lVar7 = 0;
          do {
            paVar5 = &this->field_5;
            if (1 < (ushort)uVar4) {
              paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
            }
            pRVar6 = Regexp::Incref(paVar5[lVar7].subone_);
            sub_00[lVar7] = pRVar6;
            lVar7 = lVar7 + 1;
            uVar2 = this->nsub_;
            uVar4 = (ulong)uVar2;
          } while (lVar7 < (long)(uVar4 - 1));
        }
        pRVar6 = Regexp::Concat(sub_00,(uint)uVar2,(uint)this->parse_flags_);
        *pre = pRVar6;
        operator_delete__(sub_00);
        goto LAB_00125654;
      }
    }
    bVar3 = false;
    this = local_38;
  }
  Regexp::Decref(this);
  return bVar3;
}

Assistant:

static bool IsAnchorEnd(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorEnd is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[re->nsub() - 1]->Incref();
        if (IsAnchorEnd(&sub, depth+1)) {
          Regexp** subcopy = new Regexp*[re->nsub()];
          subcopy[re->nsub() - 1] = sub;  // already have reference
          for (int i = 0; i < re->nsub() - 1; i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy, re->nsub(), re->parse_flags());
          delete[] subcopy;
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorEnd(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpEndText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}